

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::ContentEncoding::ParseCompressionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentCompression *compression)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  unsigned_long_long uVar5;
  long lVar6;
  long lVar7;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_58;
  ulong local_50;
  undefined8 local_48;
  ContentCompression *local_40;
  long local_38;
  
  lVar7 = size + start;
  local_48 = 0;
  local_58 = start;
  local_40 = compression;
  do {
    if (lVar7 <= local_58) {
      return (ulong)((byte)local_48 & 1) * 2 + -2;
    }
    lVar3 = ParseElementHeader(pReader,&local_58,lVar7,&local_38,(longlong *)&local_50);
    uVar1 = local_50;
    lVar6 = local_58;
    if (lVar3 < 0) {
      return lVar3;
    }
    if (local_38 == 0x4254) {
      uVar5 = UnserializeUInt(pReader,local_58,local_50);
      if ((long)uVar5 < 0) {
        return -2;
      }
      local_40->algo = uVar5;
      local_48 = CONCAT71((int7)(uVar5 >> 8),1);
    }
    else if (local_38 == 0x4255) {
      if ((long)local_50 < 1) {
        return -2;
      }
      if (0x80000000 < local_50) {
        return -1;
      }
      puVar4 = (uchar *)operator_new__(local_50,(nothrow_t *)&std::nothrow);
      lVar6 = local_58;
      if (puVar4 == (uchar *)0x0) {
        return -1;
      }
      iVar2 = (**pReader->_vptr_IMkvReader)(pReader,local_58,uVar1,puVar4);
      if (iVar2 != 0) {
        lVar7 = 0;
LAB_00159757:
        operator_delete__(puVar4);
        return lVar7;
      }
      if (local_40->settings != (uchar *)0x0) {
        lVar7 = -2;
        goto LAB_00159757;
      }
      local_40->settings = puVar4;
      local_40->settings_len = uVar1;
    }
    local_58 = lVar6 + uVar1;
    if (lVar7 < local_58) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseCompressionEntry(long long start, long long size,
                                            IMkvReader* pReader,
                                            ContentCompression* compression) {
  assert(pReader);
  assert(compression);

  long long pos = start;
  const long long stop = start + size;

  bool valid = false;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompAlgo) {
      long long algo = UnserializeUInt(pReader, pos, size);
      if (algo < 0)
        return E_FILE_FORMAT_INVALID;
      compression->algo = algo;
      valid = true;
    } else if (id == libwebm::kMkvContentCompSettings) {
      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      // There should be only one settings element per content compression.
      if (compression->settings != NULL) {
        delete[] buf;
        return E_FILE_FORMAT_INVALID;
      }

      compression->settings = buf;
      compression->settings_len = buflen;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  // ContentCompAlgo is mandatory
  if (!valid)
    return E_FILE_FORMAT_INVALID;

  return 0;
}